

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CGameConsole::OnRender(CGameConsole *this)

{
  int *piVar1;
  uint uVar2;
  IGraphics *pIVar3;
  IClient *pIVar4;
  ITextRender *pIVar5;
  IConsole *pIVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  CUIRect *pCVar12;
  float *pCurrent;
  CGameConsole *this_00;
  CInstance *pCVar13;
  char *pcVar14;
  int Page;
  CRingBufferBase *this_01;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar17;
  float fVar18;
  float fVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar20;
  float fVar21;
  float fVar22;
  float local_2f0;
  int local_2e0;
  CCompletionOptionRenderInfo Info;
  long local_298;
  float local_290;
  float local_28c;
  char aBuf [128];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CGameConsole *)&((this->super_CComponent).m_pClient)->m_UI;
  pCVar12 = CUI::Screen((CUI *)this_00);
  fVar18 = pCVar12->x;
  fVar19 = pCVar12->y;
  fVar21 = pCVar12->w;
  fVar22 = pCVar12->h;
  fVar15 = TimeNow(this_00);
  fVar16 = (fVar15 - (this->m_StateChangeEnd - this->m_StateChangeDuration)) /
           this->m_StateChangeDuration;
  if (1.0 <= fVar16) {
    fVar16 = 1.0;
    if (this->m_ConsoleState == 1) {
      this->m_ConsoleState = 2;
      pCVar13 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar13 = &this->m_RemoteConsole;
      }
      CLineInput::Activate(&pCVar13->m_Input,CONSOLE);
    }
    else {
      if (this->m_ConsoleState != 3) goto LAB_0013280e;
      this->m_ConsoleState = 0;
      pCVar13 = &this->m_LocalConsole;
      if (this->m_ConsoleType == 1) {
        pCVar13 = &this->m_RemoteConsole;
      }
      CLineInput::Deactivate(&pCVar13->m_Input);
    }
    fVar16 = 1.0;
  }
LAB_0013280e:
  iVar9 = this->m_ConsoleState;
  if (iVar9 == 2) {
    if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClEditor != 0) {
      Toggle(this,0);
      iVar9 = this->m_ConsoleState;
      goto LAB_00132849;
    }
LAB_00132856:
    (*(((this->super_CComponent).m_pClient)->m_pInput->super_IInterface)._vptr_IInterface[10])();
    iVar9 = this->m_ConsoleState;
  }
  else {
LAB_00132849:
    if (iVar9 == 0) goto LAB_00133525;
    if (iVar9 == 2) goto LAB_00132856;
  }
  if (iVar9 != 1) {
    if (iVar9 == 3) {
      fVar16 = 1.0 - fVar16;
    }
    else {
      fVar16 = 1.0;
    }
  }
  fVar16 = ConsoleScaleFunc(fVar16);
  fVar16 = ((fVar22 * 3.0) / 5.0) * fVar16;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
            (fVar18,fVar19,fVar21,fVar22);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffffffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x13f000000;
  local_70 = 0;
  uStack_68 = 0x3f00000000000000;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)fVar16 << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar21;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[9].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  if (this->m_ConsoleType == 1) {
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3ecccccd,0x3e4ccccd,0x3e4ccccd,0x3f666666);
  }
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,fVar16 * -0.075,fVar21 * 0.075 * 0.5,0,pIVar3,0xffffffff);
  local_298 = 0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar21;
  local_28c = fVar16;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,0xffffffff);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x100000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 2;
  local_5c = 0;
  uStack_54 = 0x3e80000000000000;
  local_4c = 3;
  local_48 = 0;
  uStack_40 = 0x3e80000000000000;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x20])(pIVar3,&local_88,4);
  local_298 = (ulong)(uint)(fVar16 + -20.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar21;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
            (pIVar3,(ulong)(uint)g_pData->m_aImages[10].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f666666);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1a])
            (0,0x3dcccccd,fVar21 * 0.015,0x3f666666,pIVar3,0xffffffff);
  local_298 = (ulong)(uint)(fVar16 + -10.0) << 0x20;
  local_28c = 10.0;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_290 = fVar21;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_298,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  this_01 = (CRingBufferBase *)&this->m_LocalConsole;
  if (this->m_ConsoleType == 1) {
    this_01 = (CRingBufferBase *)&this->m_RemoteConsole;
  }
  if ((OnRender()::s_InfoCursor == '\0') &&
     (iVar9 = __cxa_guard_acquire(&OnRender()::s_InfoCursor), iVar9 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_InfoCursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_InfoCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_InfoCursor);
  }
  local_2e0 = 1;
  aVar17.y = fVar16 + -22.0 + -12.5 + -5.0;
  CTextCursor::Reset(&OnRender::s_InfoCursor,-1);
  OnRender::s_InfoCursor.m_CursorPos.field_1.y = aVar17.y + 12.5 + 2.0;
  OnRender::s_InfoCursor.m_CursorPos.field_0.x = *(float *)((long)&this_01[0xce0].m_pLast + 4) + 3.0
  ;
  OnRender::s_InfoCursor.m_FontSize = 10.0;
  OnRender::s_InfoCursor.m_MaxWidth = -1.0;
  if ((OnRender()::s_PromptCursor == '\0') &&
     (iVar9 = __cxa_guard_acquire(&OnRender()::s_PromptCursor), iVar9 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_PromptCursor,10.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_PromptCursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_PromptCursor);
  }
  OnRender::s_PromptCursor.m_CursorPos.field_0.x = 3.0;
  OnRender::s_PromptCursor.m_CursorPos.field_1.y = aVar17.y;
  if (this->m_ConsoleType == 1) {
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient;
    if ((pIVar4->m_State & 0xfffffffeU) == 2) {
      iVar9 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
      pcVar14 = "ENTER PASSWORD> ";
      if ((char)iVar9 != '\0') {
        pcVar14 = "rcon> ";
      }
    }
    else {
      pcVar14 = "NOT CONNECTED> ";
    }
  }
  else {
    pcVar14 = "> ";
  }
  CTextCursor::Reset(&OnRender::s_PromptCursor,(int64)pcVar14);
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
            (pIVar5,&OnRender::s_PromptCursor,pcVar14,0xffffffffffffffff);
  aVar20.x = OnRender::s_PromptCursor.m_CursorPos.field_0.x +
             OnRender::s_PromptCursor.m_Advance.field_0.x;
  if ((this->m_ConsoleType == 1) &&
     (pIVar4 = ((this->super_CComponent).m_pClient)->m_pClient, (pIVar4->m_State & 0xfffffffeU) == 2
     )) {
    iVar9 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x1a])();
    bVar7 = (byte)iVar9 ^ 1;
  }
  else {
    bVar7 = 0;
  }
  *(byte *)&this_01[0xcd9].m_pConsume = bVar7;
  *(undefined4 *)((long)&this_01[0xcd7].m_pFirst + 4) = 8;
  this_01[0xcd7].m_pConsume = (CItem *)0xffffffff41200000;
  fVar18 = fVar21 + -10.0;
  *(float *)&this_01[0xcd7].m_pFirst = fVar18 - aVar20.x;
  ((anon_union_4_2_94730284_for_vector2_base<float>_1 *)(this_01 + 0xcd6))->x = (float)aVar20;
  *(float *)((long)&this_01[0xcd6].m_pProduce + 4) = aVar17.y + 13.5;
  CLineInput::Activate((CLineInput *)&this_01[0xcd5].m_pFirst,CONSOLE);
  CLineInput::Render((CLineInput *)&this_01[0xcd5].m_pFirst);
  iVar9 = this_01[0xcd5].m_Size;
  if ((OnRender()::s_LastRender == '\0') &&
     (iVar10 = __cxa_guard_acquire(&OnRender()::s_LastRender), iVar10 != 0)) {
    OnRender::s_LastRender = fVar15;
    __cxa_guard_release(&OnRender()::s_LastRender);
  }
  if (((this->m_ConsoleType == 0) ||
      (iVar10 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                  _vptr_IInterface[0x1a])(), (char)iVar10 != '\0')) &&
     (*(char *)&(this_01[0xcd8].m_pProduce)->m_pPrev != '\0')) {
    Info.m_WantedCompletion = *(int *)((long)&this_01[0xce0].m_pFirst + 4);
    Info.m_EnumCount = 0;
    Info.m_Offset = *(float *)((long)&this_01[0xce0].m_pLast + 4);
    piVar1 = &this_01[0xce0].m_Size;
    Info.m_TotalWidth = 0.0;
    pcVar14 = (char *)((long)&this_01[0xcdd].m_pConsume + 4);
    Info.m_pCursor = &OnRender::s_InfoCursor;
    pIVar6 = this->m_pConsole;
    uVar2 = *(uint *)&this_01[0xce0].m_pLast;
    uVar11 = 0;
    Info.m_pSelf = this;
    Info.m_pCurrentCmd = pcVar14;
    Info.m_pOffsetChange = (float *)piVar1;
    Info.m_Width = fVar21;
    if (this->m_ConsoleType != 0) {
      iVar10 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                 _vptr_IInterface[0x1a])();
      if ((char)iVar10 == '\0') {
        uVar11 = 0;
      }
      else {
        uVar11 = (*(((this->super_CComponent).m_pClient)->m_pClient->super_IInterface).
                   _vptr_IInterface[0x1b])();
      }
    }
    (*(pIVar6->super_IInterface)._vptr_IInterface[5])
              (pIVar6,pcVar14,(ulong)uVar2,(ulong)(uVar11 & 0xff),PossibleCommandsRenderCallback,
               &Info);
    if ((Info.m_EnumCount < 1) && ((char)this_01[0xce0].m_Flags == '\x01')) {
      bVar8 = IsMapCommandPrefix(Info.m_pCurrentCmd);
      if (bVar8) {
        Info.m_WantedCompletion = *(int *)&this_01[0xcdd].m_pConsume;
        Info.m_EnumCount = 0;
        Info.m_TotalWidth = 0.0;
        Info.m_pCurrentCmd = (char *)(this_01 + 0xcda);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[6])
                  (this->m_pConsole,Info.m_pCurrentCmd,PossibleCommandsRenderCallback);
      }
      if ((Info.m_EnumCount < 1) && ((char)this_01[0xce0].m_Flags == '\x01')) {
        str_format(aBuf,0x200,"Help: %s ",(undefined1 *)((long)&this_01[0xce2].m_pProduce + 5));
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,Info.m_pCursor,aBuf,0xffffffff);
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f400000,0x3f400000,0x3f400000,0x3f800000);
        str_format(aBuf,0x200,"Syntax: %s %s",(undefined1 *)((long)&this_01[0xce0].m_Flags + 1),
                   (undefined1 *)((long)&this_01[0xce5].m_pConsume + 5));
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[7])(pIVar5,Info.m_pCursor,aBuf,0xffffffff);
      }
    }
    fVar19 = (float)*piVar1;
    fVar21 = -fVar19;
    if (-fVar19 <= fVar19) {
      fVar21 = fVar19;
    }
    if (fVar21 <= Info.m_Width) {
      if ((fVar19 != 0.0) || (NAN(fVar19))) {
        fVar22 = (fVar15 - OnRender::s_LastRender) * 10.0;
        fVar21 = 1.0;
        if (fVar22 <= 1.0) {
          fVar21 = fVar22;
        }
        fVar22 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar21) * fVar19;
        fVar21 = fVar22 + *(float *)((long)&this_01[0xce0].m_pLast + 4);
        *(float *)((long)&this_01[0xce0].m_pLast + 4) = fVar21;
        this_01[0xce0].m_Size = (int)(fVar19 - fVar22);
      }
      else {
        fVar21 = *(float *)((long)&this_01[0xce0].m_pLast + 4);
      }
    }
    else {
      fVar21 = fVar19 + *(float *)((long)&this_01[0xce0].m_pLast + 4);
      *(float *)((long)&this_01[0xce0].m_pLast + 4) = fVar21;
      this_01[0xce0].m_Size = 0;
    }
    if (0.0 < fVar21) {
      *(undefined8 *)((long)&this_01[0xce0].m_pLast + 4) = 0;
      fVar21 = 0.0;
    }
    if ((Info.m_Width < Info.m_TotalWidth) && (fVar21 < Info.m_Width - Info.m_TotalWidth)) {
      *(float *)((long)&this_01[0xce0].m_pLast + 4) = Info.m_Width - Info.m_TotalWidth;
      this_01[0xce0].m_Size = 0;
    }
  }
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  OnRender::s_LastRender = fVar15;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])(0x3f800000,pIVar5,&OnRender::s_InfoCursor,0);
  (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  if ((OnRender()::s_Cursor == '\0') &&
     (iVar10 = __cxa_guard_acquire(&OnRender()::s_Cursor), iVar10 != 0)) {
    CTextCursor::CTextCursor(&OnRender::s_Cursor);
    __cxa_atexit(CTextCursor::~CTextCursor,&OnRender::s_Cursor,&__dso_handle);
    __cxa_guard_release(&OnRender()::s_Cursor);
  }
  aVar17.y = aVar17.y + (float)(iVar9 + -1) * -10.0;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = aVar17.y;
  OnRender::s_Cursor.m_CursorPos.field_0.x = aVar20.x;
  OnRender::s_Cursor.m_FontSize = 10.0;
  OnRender::s_Cursor.m_MaxLines = -1;
  OnRender::s_Cursor.m_MaxWidth = fVar18;
  pCurrent = (float *)CRingBufferBase::Last(this_01);
  if ((OnRender()::s_LastActivePage == '\0') &&
     (iVar9 = __cxa_guard_acquire(&OnRender()::s_LastActivePage), iVar9 != 0)) {
    OnRender::s_LastActivePage = *(int *)((long)&this_01[0xcd9].m_pLast + 4);
    __cxa_guard_release(&OnRender()::s_LastActivePage);
  }
  for (iVar9 = 0; iVar9 <= OnRender::s_LastActivePage; iVar9 = iVar9 + 1) {
    local_2f0 = 0.0;
    while( true ) {
      if (pCurrent == (float *)0x0) goto LAB_0013341a;
      CTextCursor::Reset(&OnRender::s_Cursor,-1);
      if (*(char *)(pCurrent + 1) == '\x01') {
        (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface
          [4])(0x3f800000,0x3f400000,0x3f400000,0x3f800000);
      }
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&OnRender::s_Cursor,(long)pCurrent + 5);
      (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      fVar19 = *pCurrent;
      if (fVar19 < 0.0) {
        fVar19 = OnRender::s_Cursor.m_NextLineAdvanceY + 1.0;
        *pCurrent = fVar19;
      }
      local_2f0 = local_2f0 + fVar19;
      fVar19 = aVar17.y - local_2f0;
      if (fVar19 <= 12.5) break;
      if (iVar9 == OnRender::s_LastActivePage) {
        OnRender::s_Cursor.m_CursorPos = (vec2)((ulong)(uint)fVar19 << 0x20);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar5,&OnRender::s_Cursor,0);
      }
      pCurrent = (float *)CRingBufferBase::Prev(this_01,pCurrent);
    }
    local_2e0 = local_2e0 + 1;
  }
LAB_0013341a:
  iVar9 = *(int *)((long)&this_01[0xcd9].m_pLast + 4);
  OnRender::s_LastActivePage = local_2e0 + -1;
  if (iVar9 < local_2e0 + -1) {
    OnRender::s_LastActivePage = iVar9;
  }
  if (iVar9 < 0) {
    OnRender::s_LastActivePage = 0;
  }
  *(int *)((long)&this_01[0xcd9].m_pLast + 4) = OnRender::s_LastActivePage;
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_MaxWidth = -1.0;
  pcVar14 = Localize("-Page %d-","");
  str_format(aBuf,0x80,pcVar14,(ulong)(*(int *)((long)&this_01[0xcd9].m_pLast + 4) + 1));
  OnRender::s_Cursor.m_CursorPos.field_0 =
       (anon_union_4_2_94730284_for_vector2_base<float>_1)0x41200000;
  OnRender::s_Cursor.m_CursorPos.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])(pIVar5,&OnRender::s_Cursor,aBuf,0xffffffff);
  str_format(aBuf,0x80,"v%s","0.7.5");
  CTextCursor::Reset(&OnRender::s_Cursor,-1);
  OnRender::s_Cursor.m_CursorPos.field_1.y = 0.0;
  OnRender::s_Cursor.m_CursorPos.field_0.x = fVar18;
  OnRender::s_Cursor.m_Align = 2;
  pIVar5 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])(pIVar5,&OnRender::s_Cursor,aBuf,0xffffffff);
  OnRender::s_Cursor.m_Align = 0;
LAB_00133525:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameConsole::OnRender()
{
	CUIRect Screen = *UI()->Screen();
	float ConsoleMaxHeight = Screen.h*3/5.0f;
	float ConsoleHeight;

	const float Now = TimeNow();
	float Progress = (Now - (m_StateChangeEnd - m_StateChangeDuration)) / float(m_StateChangeDuration);

	if(Progress >= 1.0f)
	{
		if(m_ConsoleState == CONSOLE_CLOSING)
		{
			m_ConsoleState = CONSOLE_CLOSED;
			CurrentConsole()->m_Input.Deactivate();
		}
		else if(m_ConsoleState == CONSOLE_OPENING)
		{
			m_ConsoleState = CONSOLE_OPEN;
			CurrentConsole()->m_Input.Activate(CONSOLE);
		}

		Progress = 1.0f;
	}

	if(m_ConsoleState == CONSOLE_OPEN && Config()->m_ClEditor)
		Toggle(CONSOLETYPE_LOCAL);

	if(m_ConsoleState == CONSOLE_CLOSED)
		return;

	if(m_ConsoleState == CONSOLE_OPEN)
		Input()->MouseModeAbsolute();

	float ConsoleHeightScale;

	if(m_ConsoleState == CONSOLE_OPENING)
		ConsoleHeightScale = ConsoleScaleFunc(Progress);
	else if(m_ConsoleState == CONSOLE_CLOSING)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f-Progress);
	else //if(console_state == CONSOLE_OPEN)
		ConsoleHeightScale = ConsoleScaleFunc(1.0f);

	ConsoleHeight = ConsoleHeightScale*ConsoleMaxHeight;

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	// do console shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	IGraphics::CColorVertex Array[4] = {
		IGraphics::CColorVertex(0, 0,0,0, 0.5f),
		IGraphics::CColorVertex(1, 0,0,0, 0.5f),
		IGraphics::CColorVertex(2, 0,0,0, 0.0f),
		IGraphics::CColorVertex(3, 0,0,0, 0.0f)};
	Graphics()->SetColorVertex(Array, 4);
	IGraphics::CQuadItem QuadItem(0, ConsoleHeight, Screen.w, 10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do background
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BG].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0.2f, 0.2f, 0.2f,0.9f);
	if(m_ConsoleType == CONSOLETYPE_REMOTE)
		Graphics()->SetColor(0.4f, 0.2f, 0.2f,0.9f);
	Graphics()->QuadsSetSubset(0,-ConsoleHeight*0.075f,Screen.w*0.075f*0.5f,0);
	QuadItem = IGraphics::CQuadItem(0, 0, Screen.w, ConsoleHeight);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do small bar shadow
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Array[0] = IGraphics::CColorVertex(0, 0,0,0, 0.0f);
	Array[1] = IGraphics::CColorVertex(1, 0,0,0, 0.0f);
	Array[2] = IGraphics::CColorVertex(2, 0,0,0, 0.25f);
	Array[3] = IGraphics::CColorVertex(3, 0,0,0, 0.25f);
	Graphics()->SetColorVertex(Array, 4);
	QuadItem = IGraphics::CQuadItem(0, ConsoleHeight-20, Screen.w, 10);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	// do the lower bar
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CONSOLE_BAR].m_Id);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 0.9f);
	Graphics()->QuadsSetSubset(0,0.1f,Screen.w*0.015f,1-0.1f);
	QuadItem = IGraphics::CQuadItem(0,ConsoleHeight-10.0f,Screen.w,10.0f);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	ConsoleHeight -= 22.0f;

	CInstance *pConsole = CurrentConsole();

	{
		float FontSize = 10.0f;
		float RowHeight = FontSize*1.25f;
		float x = 3;
		float y = ConsoleHeight - RowHeight - 5.0f;

		static CTextCursor s_InfoCursor;
		s_InfoCursor.Reset();
		s_InfoCursor.MoveTo(x+pConsole->m_CompletionRenderOffset, y+RowHeight+2.0f);
		s_InfoCursor.m_FontSize = FontSize;
		s_InfoCursor.m_MaxWidth = -1.0f;

		// render prompt
		static CTextCursor s_PromptCursor(FontSize);
		s_PromptCursor.MoveTo(x, y);
		const char *pPrompt = "> ";
		if(m_ConsoleType == CONSOLETYPE_REMOTE)
		{
			if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING)
			{
				if(Client()->RconAuthed())
					pPrompt = "rcon> ";
				else
					pPrompt = "ENTER PASSWORD> ";
			}
			else
				pPrompt = "NOT CONNECTED> ";
		}
		s_PromptCursor.Reset((int64)pPrompt);
		TextRender()->TextOutlined(&s_PromptCursor, pPrompt, -1);

		x = s_PromptCursor.AdvancePosition().x;

		// render console input (wrap line)
		pConsole->m_Input.SetHidden(m_ConsoleType == CONSOLETYPE_REMOTE && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_LOADING) && !Client()->RconAuthed());
		CTextCursor *pInputCursor = pConsole->m_Input.GetCursor();
		pInputCursor->m_Align = TEXTALIGN_BL;
		pInputCursor->m_MaxLines = -1;
		pInputCursor->m_FontSize = FontSize;
		pInputCursor->m_MaxWidth = Screen.w - 10.0f - x;
		pInputCursor->MoveTo(x, y + FontSize * 1.35f);

		pConsole->m_Input.Activate(CONSOLE); // ensure the input is active
		pConsole->m_Input.Render();

		y -= (pInputCursor->LineCount() - 1) * FontSize;

		// render possible commands
		static float s_LastRender = Now;
		if((m_ConsoleType == CONSOLETYPE_LOCAL || Client()->RconAuthed()) && pConsole->m_Input.GetString()[0])
		{
			CCompletionOptionRenderInfo Info;
			Info.m_pSelf = this;
			Info.m_WantedCompletion = pConsole->m_CompletionChosen;
			Info.m_EnumCount = 0;
			Info.m_Offset = pConsole->m_CompletionRenderOffset;
			Info.m_pOffsetChange = &pConsole->m_CompletionRenderOffsetChange;
			Info.m_Width = Screen.w;
			Info.m_TotalWidth = 0.0f;
			Info.m_pCurrentCmd = pConsole->m_aCompletionBuffer;
			Info.m_pCursor = &s_InfoCursor;
			m_pConsole->PossibleCommands(Info.m_pCurrentCmd, pConsole->m_CompletionFlagmask, m_ConsoleType != CGameConsole::CONSOLETYPE_LOCAL &&
				Client()->RconAuthed() && Client()->UseTempRconCommands(), PossibleCommandsRenderCallback, &Info);

			if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
			{
				if(IsMapCommandPrefix(Info.m_pCurrentCmd))
				{
					Info.m_WantedCompletion = pConsole->m_CompletionMapChosen;
					Info.m_EnumCount = 0;
					Info.m_TotalWidth = 0.0f;
					Info.m_pCurrentCmd = pConsole->m_aCompletionMapBuffer;
					m_pConsole->PossibleMaps(Info.m_pCurrentCmd, PossibleCommandsRenderCallback, &Info);
				}

				if(Info.m_EnumCount <= 0 && pConsole->m_IsCommand)
				{
					char aBuf[512];
					str_format(aBuf, sizeof(aBuf), "Help: %s ", pConsole->m_aCommandHelp);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
					TextRender()->TextColor(0.75f, 0.75f, 0.75f, 1);
					str_format(aBuf, sizeof(aBuf), "Syntax: %s %s", pConsole->m_aCommandName, pConsole->m_aCommandParams);
					TextRender()->TextDeferred(Info.m_pCursor, aBuf, -1);
				}
			}

			// instant scrolling if distance too long
			if(absolute(pConsole->m_CompletionRenderOffsetChange) > Info.m_Width)
			{
				pConsole->m_CompletionRenderOffset += pConsole->m_CompletionRenderOffsetChange;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// smooth scrolling
			if(pConsole->m_CompletionRenderOffsetChange)
			{
				const float Delta = pConsole->m_CompletionRenderOffsetChange * clamp((Now - s_LastRender) * 10.0f, 0.0f, 1.0f);
				pConsole->m_CompletionRenderOffset += Delta;
				pConsole->m_CompletionRenderOffsetChange -= Delta;
			}
			// clamp to first item
			if(pConsole->m_CompletionRenderOffset > 0.0f)
			{
				pConsole->m_CompletionRenderOffset = 0.0f;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
			// clamp to last item
			if(Info.m_TotalWidth > Info.m_Width && pConsole->m_CompletionRenderOffset < Info.m_Width - Info.m_TotalWidth)
			{
				pConsole->m_CompletionRenderOffset = Info.m_Width - Info.m_TotalWidth;
				pConsole->m_CompletionRenderOffsetChange = 0.0f;
			}
		}
		s_LastRender = Now;

		TextRender()->DrawTextOutlined(&s_InfoCursor);

		TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

		// render log (actual page, wrap lines)
		static CTextCursor s_Cursor;
		s_Cursor.Reset();
		s_Cursor.MoveTo(x, y);
		s_Cursor.m_FontSize = FontSize;
		s_Cursor.m_MaxLines = -1;
		s_Cursor.m_MaxWidth = Screen.w - 10.0f;

		CInstance::CBacklogEntry *pEntry = pConsole->m_Backlog.Last();
		float OffsetY = 0.0f;
		const float LineOffset = 1.0f;
		static int s_LastActivePage = pConsole->m_BacklogActPage;
		int TotalPages = 1;
		for(int Page = 0; Page <= s_LastActivePage; ++Page, OffsetY = 0.0f)
		{
			while(pEntry)
			{
				s_Cursor.Reset();
				if(pEntry->m_Highlighted)
					TextRender()->TextColor(1.0f, 0.75f, 0.75f, 1.0f);
				TextRender()->TextDeferred(&s_Cursor, pEntry->m_aText, -1);
				TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

				// get y offset (calculate it if we haven't yet)
				if(pEntry->m_YOffset < 0.0f)
					pEntry->m_YOffset = s_Cursor.BaseLineY() + LineOffset;
				OffsetY += pEntry->m_YOffset;

				// next page when lines reach the top
				if(y - OffsetY <= RowHeight)
					break;

				// just render output from actual backlog page (render bottom up)
				if(Page == s_LastActivePage)
				{
					s_Cursor.MoveTo(0.0f, y - OffsetY);
					TextRender()->DrawTextOutlined(&s_Cursor);
				}

				pEntry = pConsole->m_Backlog.Prev(pEntry);
			}
			if(!pEntry)
				break;
			TotalPages++;
		}
		pConsole->m_BacklogActPage = clamp(pConsole->m_BacklogActPage, 0, TotalPages - 1);
		s_LastActivePage = pConsole->m_BacklogActPage;

		s_Cursor.Reset();
		s_Cursor.m_MaxWidth = -1;
		// render page
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), Localize("-Page %d-"), pConsole->m_BacklogActPage+1);
		s_Cursor.MoveTo(10.0f, 0.0f);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);

		// render version
		str_format(aBuf, sizeof(aBuf), "v%s", GAME_RELEASE_VERSION);
		s_Cursor.Reset();
		s_Cursor.MoveTo(Screen.w-10.0f, 0.0f);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1.0f);
		s_Cursor.m_Align = TEXTALIGN_LEFT;
	}
}